

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void __thiscall
module_overview_txt_actions::module2(module_overview_txt_actions *this,string *module)

{
  if (this->deps_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ->",3);
    this->deps_ = true;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(module->_M_dataplus)._M_p,module->_M_string_length);
  return;
}

Assistant:

void module2( std::string const & module )
    {
        if( !deps_ )
        {
            std::cout << " ->";
            deps_ = true;
        }

        std::cout << " " << module;
    }